

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

void __thiscall
Js::InterpreterStackFrame::OP_SpreadArrayLiteral
          (InterpreterStackFrame *this,OpLayoutReg2Aux *playout)

{
  ImplicitCallFlags IVar1;
  ThreadContext *this_00;
  bool bVar2;
  JavascriptCopyOnAccessNativeIntArray *this_01;
  AuxArray<unsigned_int> *spreadIndices;
  Var pvVar3;
  
  this_00 = *(ThreadContext **)(*(long *)(this + 0x78) + 0x3b8);
  IVar1 = this_00->implicitCallFlags;
  ThreadContext::ClearImplicitCallFlags(this_00);
  pvVar3 = *(Var *)(this + (ulong)playout->R1 * 8 + 0x160);
  ValidateRegValue(this,pvVar3,false,true);
  if (pvVar3 != (Var)0x0) {
    bVar2 = VarIs<Js::JavascriptCopyOnAccessNativeIntArray>(pvVar3);
    if (bVar2) {
      this_01 = UnsafeVarTo<Js::JavascriptCopyOnAccessNativeIntArray>(pvVar3);
    }
    else {
      this_01 = (JavascriptCopyOnAccessNativeIntArray *)0x0;
    }
    if (this_01 != (JavascriptCopyOnAccessNativeIntArray *)0x0) {
      JavascriptCopyOnAccessNativeIntArray::ConvertCopyOnAccessSegment(this_01);
    }
  }
  spreadIndices =
       ByteCodeReader::ReadAuxArray<unsigned_int>
                 ((playout->super_OpLayoutAuxiliary).super_OpLayoutAuxNoReg.Offset,
                  *(FunctionBody **)(this + 0x88));
  pvVar3 = JavascriptArray::SpreadArrayArgs(pvVar3,spreadIndices,*(ScriptContext **)(this + 0x78));
  ThreadContext::CheckAndResetImplicitCallAccessorFlag(this_00);
  this_00->implicitCallFlags = this_00->implicitCallFlags | IVar1;
  SetReg<unsigned_int>(this,(playout->super_OpLayoutAuxiliary).R0,pvVar3);
  return;
}

Assistant:

void InterpreterStackFrame::OP_SpreadArrayLiteral(const unaligned OpLayoutReg2Aux * playout)
    {
        ThreadContext* threadContext = this->GetScriptContext()->GetThreadContext();
        ImplicitCallFlags savedImplicitCallFlags = threadContext->GetImplicitCallFlags();
        threadContext->ClearImplicitCallFlags();

        Var instance = GetReg(playout->R1);
#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(instance);
#endif
        const Js::AuxArray<uint32> *spreadIndices = m_reader.ReadAuxArray<uint32>(playout->Offset, this->GetFunctionBody());
        ScriptContext* scriptContext = GetScriptContext();
        Var result = JavascriptArray::SpreadArrayArgs(instance, spreadIndices, scriptContext);

        threadContext->CheckAndResetImplicitCallAccessorFlag();
        threadContext->AddImplicitCallFlags(savedImplicitCallFlags);

        SetReg(playout->R0, result);
    }